

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressed_materialization.cpp
# Opt level: O1

void __thiscall
duckdb::CompressedMaterialization::CreateProjections
          (CompressedMaterialization *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op,CompressedMaterializationInfo *info)

{
  bool bVar1;
  bool bVar2;
  type pLVar3;
  reference child_info;
  reference pvVar4;
  reference child_op;
  size_type __n;
  vector<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_true>
  compress_exprs;
  vector<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>_>_>
  local_78;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *local_60;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *local_58;
  vector<unsigned_long,_true> *local_50;
  vector<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>_>_>
  local_48;
  
  pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(op);
  if ((info->child_idxs).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (info->child_idxs).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_50 = &info->child_idxs;
    local_58 = &pLVar3->children;
    bVar2 = false;
    __n = 0;
    local_60 = op;
    do {
      child_info = vector<duckdb::CMChildInfo,_true>::operator[](&info->child_info,__n);
      local_78.
      super__Vector_base<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.
      super__Vector_base<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.
      super__Vector_base<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar1 = TryCompressChild(this,info,child_info,
                               (vector<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_true>
                                *)&local_78);
      if (bVar1) {
        pvVar4 = vector<unsigned_long,_true>::operator[](local_50,__n);
        child_op = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                   ::operator[](local_58,*pvVar4);
        local_48.
        super__Vector_base<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_78.
             super__Vector_base<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_48.
        super__Vector_base<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_78.
             super__Vector_base<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_48.
        super__Vector_base<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_78.
             super__Vector_base<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_78.
        super__Vector_base<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.
        super__Vector_base<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78.
        super__Vector_base<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        CreateCompressProjection
                  (this,child_op,
                   (vector<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_true>
                    *)&local_48,info,child_info);
        ::std::
        vector<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>_>_>
        ::~vector(&local_48);
        bVar2 = true;
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>_>_>
      ::~vector(&local_78);
      __n = __n + 1;
    } while (__n < (ulong)((long)(info->child_idxs).
                                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(info->child_idxs).
                                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3));
    if (bVar2) {
      CreateDecompressProjection(this,local_60,info);
    }
  }
  return;
}

Assistant:

void CompressedMaterialization::CreateProjections(unique_ptr<LogicalOperator> &op,
                                                  CompressedMaterializationInfo &info) {
	auto &materializing_op = *op;

	bool compressed_anything = false;
	for (idx_t i = 0; i < info.child_idxs.size(); i++) {
		auto &child_info = info.child_info[i];
		vector<unique_ptr<CompressExpression>> compress_exprs;
		if (TryCompressChild(info, child_info, compress_exprs)) {
			// We can compress: Create a projection on top of the child operator
			const auto child_idx = info.child_idxs[i];
			CreateCompressProjection(materializing_op.children[child_idx], std::move(compress_exprs), info, child_info);
			compressed_anything = true;
		}
	}

	if (compressed_anything) {
		CreateDecompressProjection(op, info);
	}
}